

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O0

err_t dstuVerify(dstu_params *params,size_t ld,octet *hash,size_t hash_len,octet *sig,octet *pubkey)

{
  word *a;
  bool_t bVar1;
  int iVar2;
  size_t sVar3;
  void *n;
  word *b;
  word *pwVar4;
  word *a_00;
  word *a_01;
  word *stack_00;
  size_t sVar5;
  dstu_params *in_RCX;
  long lVar6;
  ec_o **in_RDX;
  ulong in_RSI;
  dstu_deep_i in_R8;
  octet *in_R9;
  void *stack;
  word *s;
  word *r;
  word *y;
  word *x;
  word *h;
  ec_o *ec;
  size_t i;
  size_t order_nb;
  size_t order_no;
  size_t order_n;
  err_t code;
  void *in_stack_ffffffffffffff38;
  void *src;
  u64 *in_stack_ffffffffffffff40;
  word *dest;
  ulong local_68;
  err_t local_44;
  err_t local_c;
  
  local_44 = dstuEcCreate(in_RDX,in_RCX,in_R8);
  local_c = local_44;
  if (local_44 == 0) {
    sVar3 = wwBitSize(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
    local_68 = sVar3 + 7 >> 3;
    n = (void *)(sVar3 + 0x3f >> 6);
    bVar1 = memIsValid(in_R9,pqRam0000000000000018->no << 1);
    if ((((bVar1 == 0) || ((in_RSI & 0xf) != 0)) || (in_RSI < local_68 << 4)) ||
       (bVar1 = memIsValid(in_RDX,(size_t)in_RCX), a = pwRam0000000000000000, bVar1 == 0)) {
      dstuEcClose((ec_o *)0x176944);
      local_c = 0x6d;
    }
    else {
      b = pwRam0000000000000000 + pqRam0000000000000018->n;
      pwVar4 = b + pqRam0000000000000018->n;
      a_00 = pwVar4 + pqRam0000000000000018->n;
      a_01 = a_00 + pqRam0000000000000018->n;
      stack_00 = a_01 + pqRam0000000000000018->n;
      bVar1 = (*pqRam0000000000000018->from)(b,in_R9,pqRam0000000000000018,stack_00);
      if ((bVar1 == 0) ||
         (bVar1 = (*pqRam0000000000000018->from)
                            (pwVar4,in_R9 + pqRam0000000000000018->no,pqRam0000000000000018,stack_00
                            ), bVar1 == 0)) {
        dstuEcClose((ec_o *)0x176a71);
        local_c = 0x1f9;
      }
      else {
        if (in_RCX < (dstu_params *)pqRam0000000000000018->no) {
          memCopy(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x176ab2);
          memSet(in_stack_ffffffffffffff40,(octet)((ulong)in_stack_ffffffffffffff38 >> 0x38),
                 0x176adb);
        }
        else {
          memCopy(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x176afc);
          sVar5 = gf2Deg(pqRam0000000000000018);
          lVar6 = pqRam0000000000000018->no - 1;
          *(byte *)((long)a + lVar6) =
               *(byte *)((long)a + lVar6) & (char)(1 << ((byte)sVar5 & 7)) - 1U;
        }
        (*pqRam0000000000000018->from)(a,(octet *)a,pqRam0000000000000018,stack_00);
        bVar1 = wwIsZero(a,pqRam0000000000000018->n);
        if (bVar1 != 0) {
          wwCopy(a,pqRam0000000000000018->unity,pqRam0000000000000018->n);
        }
        u64From(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x176bb7);
        u64From(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x176bdd);
        for (; local_68 < in_RSI >> 4; local_68 = local_68 + 1) {
          if ((in_R8[local_68] != (_func_size_t_size_t_size_t_size_t_size_t)0x0) ||
             (in_R8[local_68 + (in_RSI >> 4)] != (_func_size_t_size_t_size_t_size_t_size_t)0x0)) {
            dstuEcClose((ec_o *)0x176c42);
            return 0x1fe;
          }
        }
        bVar1 = wwIsZero(a_00,(size_t)n);
        if ((((bVar1 == 0) && (bVar1 = wwIsZero(a_01,(size_t)n), bVar1 == 0)) &&
            (iVar2 = wwCmp(a_00,pwRam0000000000000038,(size_t)n), iVar2 < 0)) &&
           (iVar2 = wwCmp(a_01,pwRam0000000000000038,(size_t)n), iVar2 < 0)) {
          src = n;
          dest = b;
          bVar1 = ecAddMulA(b,(ec_o *)0x0,stack_00,2,uRam0000000000000030,a_01,n,b,a_00,n);
          if (bVar1 == 0) {
            dstuEcClose((ec_o *)0x176d3f);
            local_c = 0x1fe;
          }
          else {
            (*pqRam0000000000000018->mul)(pwVar4,b,a,pqRam0000000000000018,stack_00);
            (*pqRam0000000000000018->to)((octet *)a_01,pwVar4,pqRam0000000000000018,stack_00);
            u64From(dest,src,0x176db6);
            wwTrimHi(a_01,(size_t)n,sVar3 - 1);
            bVar1 = wwEq(a_00,a_01,(size_t)n);
            if (bVar1 == 0) {
              local_44 = 0x1fe;
            }
            dstuEcClose((ec_o *)0x176dfc);
            local_c = local_44;
          }
        }
        else {
          dstuEcClose((ec_o *)0x176cd0);
          local_c = 0x1fe;
        }
      }
    }
  }
  return local_c;
}

Assistant:

err_t dstuVerify(const dstu_params* params, size_t ld, const octet hash[], 
	size_t hash_len, const octet sig[], const octet pubkey[])
{
	err_t code;
	size_t order_n, order_no, order_nb, i;
	// состояние
	ec_o* ec = 0;
	word* h;		/* хэш-значение как элемент поля */
	word* x;		/* х-координата эфемерного ок */
	word* y;		/* y-координата эфемерного ок */
	word* r;		/* первая часть ЭЦП */
	word* s;		/* вторая часть ЭЦП */
	void* stack;
	// старт
	code = dstuEcCreate(&ec, params, dstuVerify_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	order_nb = wwBitSize(ec->order, ec->f->n);
	order_no = O_OF_B(order_nb);
	order_n = W_OF_B(order_nb);
	// проверить входные указатели
	// шаги 1, 2: обработка идентификатора хэш-функции
	// шаг 3: проверить ld
	if (!memIsValid(pubkey, 2 * ec->f->no) || 
		ld % 16 != 0 || ld < 16 * order_no ||
		!memIsValid(hash, hash_len))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	h = objEnd(ec, word);
	x = h + ec->f->n;
	y = x + ec->f->n;
	r = y + ec->f->n;
	s = r + ec->f->n;
	stack = s + ec->f->n;
	// шаг 4: проверить params
	// шаг 5: проверить pubkey
	// [минимальная проверка принадлежности координат базовому полю]
	if (!qrFrom(x, pubkey, ec->f, stack) || 
		!qrFrom(y, pubkey + ec->f->no, ec->f, stack))
	{
		dstuEcClose(ec);
		return ERR_BAD_PUBKEY;
	}
	// шаги 6, 7: хэширование
	// шаг 8: перевести hash в элемент основного поля h
	// [алгоритм из раздела 5.9 ДСТУ]
	if (hash_len < ec->f->no)
	{
		memCopy(h, hash, hash_len);
		memSetZero((octet*)h + hash_len, ec->f->no - hash_len);
	}
	else
	{
		memCopy(h, hash, ec->f->no);
		// memTrimHi(h, ec->f->no, gf2Deg(ec->f));
		((octet*)h)[ec->f->no - 1] &= (1 << gf2Deg(ec->f) % 8) - 1;
	}
	qrFrom(h, (octet*)h, ec->f, stack);
	// шаг 8: если h = 0, то h <- 1
	if (qrIsZero(h, ec->f))
		qrSetUnity(h, ec->f);
	// шаг 9: выделить части подписи
	wwFrom(r, sig, order_no);
	wwFrom(s, sig + ld / 16, order_no);
	for (i = order_no; i < ld / 16; ++i)
		if (sig[i] || sig[i + ld / 16])
		{
			dstuEcClose(ec);
			return ERR_BAD_SIG;
		}
	// шаги 10, 11: проверить r и s
	if (wwIsZero(r, order_n) ||
		wwIsZero(s, order_n) ||
		wwCmp(r, ec->order, order_n) >= 0 ||
		wwCmp(s, ec->order, order_n) >= 0)
	{
		dstuEcClose(ec);
		return ERR_BAD_SIG;
	}
	// шаг 12: R <- sP + rQ
	if (!ecAddMulA(x, ec, stack, 2, ec->base, s, order_n, x, r, order_n))
	{
		dstuEcClose(ec);
		return ERR_BAD_SIG;
	}
	// шаг 13: y <- h * x
	qrMul(y, x, h, ec->f, stack);
	// шаг 14: r' <- \bar{y}
	ASSERT(order_n <= ec->f->n);
	qrTo((octet*)s, y, ec->f, stack);
	wwFrom(s, s, order_no);
	wwTrimHi(s, order_n, order_nb - 1);
	// шаг 15:
	if (!wwEq(r, s, order_n))
		code = ERR_BAD_SIG;
	// все нормально
	dstuEcClose(ec);
	return code;
}